

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O3

TimingControl * __thiscall
slang::ast::ContinuousAssignSymbol::getDelay(ContinuousAssignSymbol *this)

{
  Scope *pSVar1;
  SyntaxNode *pSVar2;
  int iVar3;
  undefined4 extraout_var;
  Expression *pEVar5;
  bool bVar6;
  LookupLocation LVar7;
  ExpressionVarVisitor visitor;
  ASTContext context;
  ExpressionVarVisitor local_51;
  ASTContext local_50;
  TimingControl *pTVar4;
  
  if ((this->delay).super__Optional_base<const_slang::ast::TimingControl_*,_true,_true>._M_payload.
      super__Optional_payload_base<const_slang::ast::TimingControl_*>._M_engaged != true) {
    pSVar1 = (this->super_Symbol).parentScope;
    pSVar2 = (this->super_Symbol).originatingSyntax;
    if (((pSVar2 == (SyntaxNode *)0x0 || pSVar1 == (Scope *)0x0) ||
        (pSVar2 = pSVar2->parent, pSVar2 == (SyntaxNode *)0x0)) ||
       (pSVar2 = pSVar2[4].parent, pSVar2 == (SyntaxNode *)0x0)) {
      (this->delay).super__Optional_base<const_slang::ast::TimingControl_*,_true,_true>._M_payload.
      super__Optional_payload_base<const_slang::ast::TimingControl_*>._M_engaged = true;
      (this->delay).super__Optional_base<const_slang::ast::TimingControl_*,_true,_true>._M_payload.
      super__Optional_payload_base<const_slang::ast::TimingControl_*>._M_payload._M_value =
           (TimingControl *)0x0;
      return (TimingControl *)0x0;
    }
    LVar7 = LookupLocation::before(&this->super_Symbol);
    local_50.lookupIndex = LVar7.index;
    local_50.flags.m_bits = 0x20;
    local_50.instanceOrProc = (Symbol *)0x0;
    local_50.firstTempVar = (TempVarSymbol *)0x0;
    local_50.randomizeDetails = (RandomizeDetails *)0x0;
    local_50.assertionInstance = (AssertionInstanceDetails *)0x0;
    local_50.scope.ptr = pSVar1;
    iVar3 = TimingControl::bind((int)pSVar2,(sockaddr *)&local_50,local_50.lookupIndex);
    pTVar4 = (TimingControl *)CONCAT44(extraout_var,iVar3);
    bVar6 = (this->delay).super__Optional_base<const_slang::ast::TimingControl_*,_true,_true>.
            _M_payload.super__Optional_payload_base<const_slang::ast::TimingControl_*>._M_engaged ==
            false;
    if (bVar6) {
      (this->delay).super__Optional_base<const_slang::ast::TimingControl_*,_true,_true>._M_payload.
      super__Optional_payload_base<const_slang::ast::TimingControl_*>._M_engaged = true;
      (this->delay).super__Optional_base<const_slang::ast::TimingControl_*,_true,_true>._M_payload.
      super__Optional_payload_base<const_slang::ast::TimingControl_*>._M_payload._M_value = pTVar4;
    }
    else {
      (this->delay).super__Optional_base<const_slang::ast::TimingControl_*,_true,_true>._M_payload.
      super__Optional_payload_base<const_slang::ast::TimingControl_*>._M_payload._M_value = pTVar4;
      if (bVar6) {
        std::__throw_bad_optional_access();
      }
    }
    if (((pTVar4->kind == Delay3) && (pTVar4[1].syntax != (SyntaxNode *)0x0)) &&
       (pEVar5 = getAssignment(this), pEVar5->kind == Assignment)) {
      pEVar5 = (Expression *)pEVar5[1].constant;
      local_51.anyVars = false;
      Expression::visitExpression<slang::ast::Expression_const,slang::ast::ExpressionVarVisitor&>
                (pEVar5,pEVar5,&local_51);
      if (local_51.anyVars == true) {
        ASTContext::addDiag(&local_50,(DiagCode)0x2c0006,pEVar5->sourceRange);
      }
    }
  }
  return (this->delay).super__Optional_base<const_slang::ast::TimingControl_*,_true,_true>.
         _M_payload.super__Optional_payload_base<const_slang::ast::TimingControl_*>._M_payload.
         _M_value;
}

Assistant:

const TimingControl* ContinuousAssignSymbol::getDelay() const {
    if (delay)
        return *delay;

    auto scope = getParentScope();
    auto syntax = getSyntax();
    if (!scope || !syntax || !syntax->parent) {
        delay = nullptr;
        return nullptr;
    }

    auto delaySyntax = syntax->parent->as<ContinuousAssignSyntax>().delay;
    if (!delaySyntax) {
        delay = nullptr;
        return nullptr;
    }

    ASTContext context(*scope, LookupLocation::before(*this), ASTFlags::NonProcedural);
    delay = &TimingControl::bind(*delaySyntax, context);

    // A multi-delay is disallowed if the lhs references variables.
    auto& d = *delay.value();
    if (d.kind == TimingControlKind::Delay3) {
        auto& d3 = d.as<Delay3Control>();
        if (d3.expr2) {
            auto& expr = getAssignment();
            if (expr.kind == ExpressionKind::Assignment) {
                auto& left = expr.as<AssignmentExpression>().left();
                ExpressionVarVisitor visitor;
                left.visit(visitor);
                if (visitor.anyVars)
                    context.addDiag(diag::Delay3OnVar, left.sourceRange);
            }
        }
    }

    return *delay;
}